

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (-1 < *(char *)(in_RDI + 0x54)) {
    for (local_c = 0; local_c < *(char *)(in_RDI + 0x54); local_c = local_c + 1) {
      releasePageNotNull((MemPage *)0x16c85f);
    }
    releasePageNotNull((MemPage *)0x16c87d);
    *(undefined1 *)(in_RDI + 0x54) = 0xff;
  }
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  if( pCur->iPage>=0 ){
    for(i=0; i<pCur->iPage; i++){
      releasePageNotNull(pCur->apPage[i]);
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
}